

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DLoadSaveMenu::MouseEvent(DLoadSaveMenu *this,int type,int x,int y)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int lineno;
  int y_local;
  int x_local;
  int type_local;
  DLoadSaveMenu *this_local;
  
  if ((((x < this->listboxLeft) || (this->listboxLeft + this->listboxWidth <= x)) ||
      (y < this->listboxTop)) || (this->listboxTop + this->listboxHeight <= y)) {
    this->Selected = -1;
  }
  else {
    iVar4 = (y - this->listboxTop) / this->rowHeight;
    iVar1 = this->TopItem;
    uVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (iVar1 + iVar4 < (int)uVar3) {
      this->Selected = this->TopItem + iVar4;
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
      if ((type == 2) &&
         (uVar3 = (*(this->super_DListMenu).super_DMenu.super_DObject._vptr_DObject[8])(this,6,1),
         (uVar3 & 1) != 0)) {
        return true;
      }
    }
    else {
      this->Selected = -1;
    }
  }
  bVar2 = DListMenu::MouseEvent(&this->super_DListMenu,type,x,y);
  return bVar2;
}

Assistant:

bool DLoadSaveMenu::MouseEvent(int type, int x, int y)
{
	if (x >= listboxLeft && x < listboxLeft + listboxWidth && 
		y >= listboxTop && y < listboxTop + listboxHeight)
	{
		int lineno = (y - listboxTop) / rowHeight;

		if (TopItem + lineno < (int)SaveGames.Size())
		{
			Selected = TopItem + lineno;
			UnloadSaveData ();
			ExtractSaveData (Selected);
			if (type == MOUSE_Release)
			{
				if (MenuEvent(MKEY_Enter, true))
				{
					return true;
				}
			}
		}
		else Selected = -1;
	}
	else Selected = -1;

	return Super::MouseEvent(type, x, y);
}